

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

value * mjs::parse_value(value *__return_storage_ptr__,gc_heap *h,string *s)

{
  istringstream *piVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  reference pcVar7;
  long *plVar8;
  wostream *pwVar9;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  wstring_view local_438;
  string local_428;
  wstring local_418 [32];
  wstring_view local_3f8;
  wostringstream local_3e8 [8];
  wostringstream _woss;
  char local_26c;
  wstring local_268 [4];
  uint16_t ch;
  bool escape;
  wstring res;
  double val_1;
  char *c;
  iterator __end5;
  iterator __begin5;
  string *__range5;
  string name;
  string val;
  undefined1 local_1d0 [8];
  anon_class_16_2_de30df33 require_complete;
  string type;
  istringstream iss;
  string *s_local;
  gc_heap *h_local;
  
  piVar1 = (istringstream *)(type.field_2._M_local_buf + 8);
  std::__cxx11::istringstream::istringstream(piVar1,s,8);
  std::__cxx11::string::string((string *)&require_complete.s);
  local_1d0 = (undefined1  [8])piVar1;
  require_complete.iss = (istringstream *)s;
  piVar5 = std::operator>>((istream *)piVar1,(string *)&require_complete.s);
  bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
  if (!bVar2) goto LAB_0011af6a;
  while( true ) {
    std::__cxx11::istringstream::rdbuf();
    lVar6 = std::streambuf::in_avail();
    bVar2 = false;
    if (lVar6 != 0) {
      iVar4 = std::istream::peek();
      iVar4 = isblank(iVar4);
      bVar2 = iVar4 != 0;
    }
    if (!bVar2) break;
    std::istream::get();
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &require_complete.s,"undefined");
  if (bVar2) {
    parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0);
    value::value(__return_storage_ptr__,(value *)value::undefined);
    goto LAB_0011b05d;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &require_complete.s,"null");
  if (bVar2) {
    parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0);
    value::value(__return_storage_ptr__,(value *)value::null);
    goto LAB_0011b05d;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &require_complete.s,"boolean");
  if (bVar2) {
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
    piVar5 = std::operator>>((istream *)(type.field_2._M_local_buf + 8),
                             (string *)(name.field_2._M_local_buf + 8));
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if ((bVar2) &&
       ((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&name.field_2 + 8),"true"), bVar2 ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&name.field_2 + 8),"false"), bVar2)))) {
      parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&name.field_2 + 8),"true");
      value::value(__return_storage_ptr__,bVar2);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    if (bVar2) goto LAB_0011b05d;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &require_complete.s,"number");
  if (bVar2) {
    std::__cxx11::istringstream::rdbuf();
    lVar6 = std::streambuf::in_avail();
    if (lVar6 != 0) {
      iVar4 = std::istream::peek();
      iVar4 = isalpha(iVar4);
      if (iVar4 == 0) {
        plVar8 = (long *)std::istream::operator>>
                                   ((istream *)(type.field_2._M_local_buf + 8),
                                    (double *)((long)&res.field_2 + 8));
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
        if (bVar2) {
          parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0);
          value::value(__return_storage_ptr__,(double)res.field_2._8_8_);
          goto LAB_0011b05d;
        }
      }
      else {
        std::__cxx11::string::string((string *)&__range5);
        piVar5 = std::operator>>((istream *)(type.field_2._M_local_buf + 8),(string *)&__range5);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (bVar2) {
          parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0);
          __end5._M_current = (char *)std::__cxx11::string::begin();
          c = (char *)std::__cxx11::string::end();
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&c), bVar2) {
            pcVar7 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end5);
            iVar4 = tolower((int)*pcVar7);
            *pcVar7 = (char)iVar4;
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end5);
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range5,"infinity");
          if (bVar2) {
            value::value(__return_storage_ptr__,INFINITY);
            bVar2 = true;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range5,"nan");
            if (!bVar2) goto LAB_0011aabe;
            value::value(__return_storage_ptr__,NAN);
            bVar2 = true;
          }
        }
        else {
LAB_0011aabe:
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&__range5);
        if (bVar2) goto LAB_0011b05d;
      }
    }
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &require_complete.s,"string");
  if (bVar2) {
    iVar4 = std::istream::get();
    if (iVar4 == 0x27) {
      std::__cxx11::wstring::wstring(local_268);
      bVar2 = false;
      while( true ) {
        std::__cxx11::istringstream::rdbuf();
        lVar6 = std::streambuf::in_avail();
        if (lVar6 == 0) break;
        sVar3 = std::istream::get();
        if (bVar2) {
          switch(sVar3) {
          case 0x22:
          case 0x27:
          case 0x5c:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          default:
            std::__cxx11::wostringstream::wostringstream(local_3e8);
            pwVar9 = std::operator<<((wostream *)local_3e8,"Not implemented: ");
            pwVar9 = std::operator<<(pwVar9,"Unhandled escape sequence \\");
            local_26c = (char)sVar3;
            std::operator<<(pwVar9,local_26c);
            std::__cxx11::wostringstream::str();
            local_3f8 = (wstring_view)
                        std::__cxx11::wstring::operator_cast_to_basic_string_view(local_418);
            throw_runtime_error(&local_3f8,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                                ,0x76);
          case 0x62:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x66:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x6e:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x72:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x74:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x75:
            get_escape_sequence((istream *)(type.field_2._M_local_buf + 8));
            std::__cxx11::wstring::push_back((wchar_t)local_268);
            break;
          case 0x76:
            std::__cxx11::wstring::push_back((wchar_t)local_268);
          }
          bVar2 = false;
        }
        else if (sVar3 == 0x5c) {
          bVar2 = true;
        }
        else {
          if (sVar3 == 0x27) {
            parse_value::anon_class_16_2_de30df33::operator()((anon_class_16_2_de30df33 *)local_1d0)
            ;
            local_438 = (wstring_view)
                        std::__cxx11::wstring::operator_cast_to_basic_string_view(local_268);
            string::string(&local_428,h,&local_438);
            value::value(__return_storage_ptr__,&local_428);
            string::~string(&local_428);
            bVar2 = true;
            goto LAB_0011af39;
          }
          std::__cxx11::wstring::push_back((wchar_t)local_268);
        }
      }
      bVar2 = false;
LAB_0011af39:
      std::__cxx11::wstring::~wstring(local_268);
      if (bVar2) {
LAB_0011b05d:
        std::__cxx11::string::~string((string *)&require_complete.s);
        std::__cxx11::istringstream::~istringstream
                  ((istringstream *)(type.field_2._M_local_buf + 8));
        return __return_storage_ptr__;
      }
    }
  }
LAB_0011af6a:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_478,"Invalid test spec value \"",s);
  std::operator+(&local_458,&local_478,"\"");
  std::runtime_error::runtime_error(this,(string *)&local_458);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value parse_value(gc_heap& h, const std::string& s) {
    std::istringstream iss{s};
    std::string type;

    auto require_complete = [&]() {
        if (iss.rdbuf()->in_avail()) {
            throw std::runtime_error("Invalid test spec. Parse not complete in \"" + s + "\" Unparsed: \"" + s.substr(iss.tellg()) + "\"");
        }
    };

    if (iss >> type) {
        while (iss.rdbuf()->in_avail() && isblank(iss.peek()))
            iss.get();

        if (type == "undefined") {
            require_complete();
            return value::undefined;
        } else if (type == "null") {
            require_complete();
            return value::null;
        } else if (type == "boolean") {
            std::string val;
            if ((iss >> val) && (val == "true" || val == "false")) {
                require_complete();
                return mjs::value{val == "true"};
            }
        }
        if (type == "number" && iss.rdbuf()->in_avail()) {
            if (isalpha(iss.peek())) {
                std::string name;
                if (iss >> name) {
                    require_complete();
                    for (auto& c: name) c = static_cast<char>(tolower(c));
                    if (name == "infinity") return mjs::value{INFINITY};
                    if (name == "nan") return mjs::value{NAN};
                }
            } else {
                double val;
                if (iss >> val) {
                    require_complete();
                    return value{val};
                }
            }
        }
        if (type == "string" && iss.get() == '\'') {
            std::wstring res;
            bool escape = false;
            while (iss.rdbuf()->in_avail()) {
                const auto ch = static_cast<uint16_t>(iss.get());
                if (escape)  {
                    switch (ch) {
                    case 'b': res.push_back('\x08'); break;
                    case 't': res.push_back('\t'); break;
                    case 'n': res.push_back('\n'); break;
                    case 'v': res.push_back('\x0b'); break;
                    case 'f': res.push_back('\x0c'); break;
                    case 'r': res.push_back('\r'); break;
                    case 'u': res.push_back(get_escape_sequence(iss)); break;
                    case '\"': [[fallthrough]];
                    case '\'': [[fallthrough]];
                    case '\\': res.push_back(ch); break;
                    default:
                        NOT_IMPLEMENTED("Unhandled escape sequence \\" << (char)ch);
                    }
                    escape = false;
                } else if (ch == '\\') {
                    escape = true;
                } else if (ch == '\'') {
                    require_complete();
                    return value{mjs::string{h, res}};
                } else {
                    res.push_back(ch);
                }
            }
        }
    }
    throw std::runtime_error("Invalid test spec value \"" + s + "\"");
}